

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O0

void __thiscall dna_string::build_rank_support(dna_string *this)

{
  p_rank r;
  p_rank r_00;
  reference pvVar1;
  ulong block_number_00;
  ulong __n;
  dna_string *in_RDI;
  uint64_t block_number;
  uint64_t superblock_number;
  p_rank local_rank;
  uint64_t block_number_1;
  uint64_t superblock_number_1;
  uint64_t bl;
  p_rank block_r;
  p_rank superblock_r;
  uint64_t local_130;
  uint64_t local_128;
  uint64_t local_120;
  uint64_t local_118;
  uint64_t in_stack_fffffffffffffef0;
  uint64_t in_stack_fffffffffffffef8;
  dna_string *in_stack_ffffffffffffff00;
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  p_rank local_e0;
  p_rank local_c0;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  p_rank local_48;
  p_rank local_28;
  
  memset(&local_28,0,0x20);
  memset(&local_48,0,0x20);
  for (local_50 = 0; local_50 < in_RDI->n_blocks - 1; local_50 = local_50 + 1) {
    local_58 = local_50 >> 0x19;
    local_60 = local_50 & 0x1ffffff;
    if (local_60 == 0) {
      pvVar1 = std::vector<p_rank,_std::allocator<p_rank>_>::operator[]
                         (&in_RDI->superblock_ranks,local_58);
      pvVar1->A = local_28.A;
      pvVar1->C = local_28.C;
      pvVar1->G = local_28.G;
      pvVar1->T = local_28.T;
      memset(&local_80,0,0x20);
      local_48.A = local_80;
      local_48.C = local_78;
      local_48.G = local_70;
      local_48.T = local_68;
    }
    local_a0 = local_48.A;
    local_98 = local_48.C;
    local_90 = local_48.G;
    local_88 = local_48.T;
    r.C = local_48.C;
    r.A = local_48.A;
    r.G = local_48.G;
    r.T = local_48.T;
    set_counters(in_RDI,local_58,local_60,r);
    block_rank(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    p_rank::operator+(&local_e0,&local_48,&local_c0);
    local_48.A = local_e0.A;
    local_48.C = local_e0.C;
    local_48.G = local_e0.G;
    local_48.T = local_e0.T;
    p_rank::operator+((p_rank *)&stack0xffffffffffffff00,&local_28,&local_c0);
    local_28.C = local_f8;
    local_28.G = local_f0;
    local_28.T = local_e8;
    local_28.A = (uint64_t)in_stack_ffffffffffffff00;
  }
  __n = in_RDI->n_blocks - 1 >> 0x19;
  block_number_00 = in_RDI->n_blocks - 1 & 0x1ffffff;
  if (block_number_00 == 0) {
    pvVar1 = std::vector<p_rank,_std::allocator<p_rank>_>::operator[](&in_RDI->superblock_ranks,__n)
    ;
    pvVar1->A = local_28.A;
    pvVar1->C = local_28.C;
    pvVar1->G = local_28.G;
    pvVar1->T = local_28.T;
    memset(&local_130,0,0x20);
    local_48.A = local_130;
    local_48.C = local_128;
    local_48.G = local_120;
    local_48.T = local_118;
  }
  r_00.C = local_48.C;
  r_00.A = local_48.A;
  r_00.G = local_48.G;
  r_00.T = local_48.T;
  set_counters(in_RDI,__n,block_number_00,r_00);
  return;
}

Assistant:

void build_rank_support(){

		p_rank superblock_r = {};
		p_rank block_r = {};

		for(uint64_t bl = 0; bl < n_blocks-1; ++bl){

			uint64_t superblock_number = bl/BLOCKS_PER_SUPERBLOCK;
			uint64_t block_number = bl%BLOCKS_PER_SUPERBLOCK;

			if(block_number == 0){

				superblock_ranks[superblock_number]=superblock_r;
				block_r = {};

			}

			set_counters(superblock_number, block_number,block_r);

			p_rank local_rank = block_rank(superblock_number, block_number);

			block_r = block_r + local_rank;
			superblock_r = superblock_r + local_rank;

		}

		uint64_t superblock_number = (n_blocks-1)/BLOCKS_PER_SUPERBLOCK;
		uint64_t block_number = (n_blocks-1)%BLOCKS_PER_SUPERBLOCK;

		if(block_number == 0){

			superblock_ranks[superblock_number]=superblock_r;
			block_r = {};

		}

		set_counters(superblock_number, block_number,block_r);

		assert(check_rank());

	}